

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O1

U64 __thiscall USBPacket::AddRawByteFrames(USBPacket *this,USBAnalyzerResults *pResults)

{
  pointer puVar1;
  pointer puVar2;
  U64 UVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  string bytes_row;
  long *local_b8;
  long local_a8;
  long lStack_a0;
  unsigned_long_long local_98;
  U64 local_90;
  ulong local_88;
  undefined8 uStack_80;
  undefined2 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  
  Frame::Frame((Frame *)&local_98);
  local_78 = 0xb;
  uStack_80 = 0;
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  lVar6 = 0x40;
  for (uVar7 = 0;
      puVar1 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(this->mData).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
      uVar7 = uVar7 + 1) {
    int2str_sal_abi_cxx11_(&local_50,(ulong)puVar1[uVar7],Hexadecimal,8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_a8 = *plVar5;
      lStack_a0 = plVar4[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar5;
      local_b8 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    puVar2 = (this->mBitBeginSamples).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_98 = *(undefined8 *)((long)puVar2 + lVar6 + -0x40);
    local_90 = *(undefined8 *)((long)puVar2 + lVar6);
    local_88 = (ulong)(this->mData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7];
    lVar6 = lVar6 + 0x40;
    AnalyzerResults::AddFrame((Frame *)pResults);
  }
  local_98 = (this->mBitBeginSamples).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
  local_90 = this->mSampleEnd;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 5;
  AnalyzerResults::AddFrame((Frame *)pResults);
  AnalyzerResults::CommitResults();
  UVar3 = local_90;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  Frame::~Frame((Frame *)&local_98);
  return UVar3;
}

Assistant:

U64 USBPacket::AddRawByteFrames( USBAnalyzerResults* pResults )
{
    // raw data
    size_t bc;
    Frame f;
    f.mType = FT_Byte;
    f.mData2 = 0;
    f.mFlags = FF_None;
    std::string bytes_row;
    for( bc = 0; bc < mData.size(); ++bc )
    {
        bytes_row += int2str_sal( mData[ bc ], Hexadecimal, 8 ) + ", ";

        f.mStartingSampleInclusive = *( mBitBeginSamples.begin() + bc * 8 );
        f.mEndingSampleInclusive = *( mBitBeginSamples.begin() + ( bc + 1 ) * 8 );
        f.mData1 = mData[ bc ];
        pResults->AddFrame( f );
    }

    // add the EOP frame
    f.mStartingSampleInclusive = mBitBeginSamples.back();
    // EOP is 2 bits SE0 and one bit J, so add another bit
    f.mEndingSampleInclusive = mSampleEnd;
    f.mData1 = f.mData2 = 0;
    f.mFlags = FF_None;
    f.mType = FT_EOP;
    pResults->AddFrame( f );

    pResults->CommitResults();

    return f.mEndingSampleInclusive;
}